

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void __thiscall
DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
::ascend(DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
         *this,uint i)

{
  uint uVar1;
  pointer pHVar2;
  HeapEntry HVar3;
  mapped_type *pmVar4;
  uint uVar5;
  ulong uVar6;
  
  if (i == 0) {
    uVar6 = 0;
  }
  else {
    do {
      uVar1 = i - 1;
      uVar5 = uVar1 >> 1;
      uVar6 = (ulong)uVar5;
      pHVar2 = (this->heap).
               super__Vector_base<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry,_std::allocator<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pHVar2[i].priority < pHVar2[uVar6].priority ||
          pHVar2[i].priority == pHVar2[uVar6].priority) {
        uVar6 = (ulong)i;
        break;
      }
      HVar3 = pHVar2[i];
      pHVar2[i] = pHVar2[uVar6];
      pHVar2[uVar6] = HVar3;
      pmVar4 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->index,
                            &(this->heap).
                             super__Vector_base<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry,_std::allocator<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start[i].data);
      *pmVar4 = i;
      i = uVar5;
    } while (1 < uVar1);
  }
  pmVar4 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->index,
                        &(this->heap).
                         super__Vector_base<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry,_std::allocator<DynamicHeap<unsigned_int,_float,_std::less<float>,_std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>::HeapEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6].data);
  *pmVar4 = (mapped_type)uVar6;
  return;
}

Assistant:

void
DynamicHeap<T, P, C, M>::ascend(unsigned int i)
{
  for (unsigned int j; i && !ordered(j = parent(i), i); i = j)
    swap(i, j);
  index[heap[i].data] = i;
}